

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Conditional *ast)

{
  AST *pAVar1;
  
  (*this->_vptr_CompilerPass[6])(this,&ast->cond);
  (*this->_vptr_CompilerPass[1])(this,&ast->thenFodder);
  pAVar1 = ast->branchFalse;
  (*this->_vptr_CompilerPass[6])(this,&ast->branchTrue);
  if (pAVar1 != (AST *)0x0) {
    (*this->_vptr_CompilerPass[1])(this,&ast->elseFodder);
    (*this->_vptr_CompilerPass[6])(this,&ast->branchFalse);
    return;
  }
  return;
}

Assistant:

void CompilerPass::visit(Conditional *ast)
{
    expr(ast->cond);
    fodder(ast->thenFodder);
    if (ast->branchFalse != nullptr) {
        expr(ast->branchTrue);
        fodder(ast->elseFodder);
        expr(ast->branchFalse);
    } else {
        expr(ast->branchTrue);
    }
}